

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O2

bool __thiscall
sfm::Triangulate::triangulate
          (Triangulate *this,
          vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *poses,
          vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *positions,
          Vec3d *track_pos,Statistics *stats,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *outliers)

{
  double *__return_storage_ptr__;
  pointer pVVar1;
  pointer puVar2;
  double dVar3;
  pointer puVar4;
  pointer puVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  Statistics *pSVar7;
  undefined8 uVar8;
  undefined1 auVar9 [8];
  long lVar10;
  pointer ppCVar11;
  invalid_argument *this_00;
  pointer ppCVar12;
  bool bVar13;
  size_type __n;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  undefined1 local_168 [8];
  Vec3d tmp_pos;
  Vec3d ray1;
  Vector<float,_2> local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_110;
  Statistics *local_108;
  Vector<double,3> *local_100;
  undefined1 auStack_f8 [8];
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> position_pair;
  Vec3f best_pos;
  undefined1 auStack_a8 [8];
  Vec3d ray0;
  undefined1 auStack_88 [8];
  vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> pose_pair;
  undefined1 auStack_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp_outliers;
  undefined1 auStack_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_outliers;
  
  lVar10 = (long)(poses->
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(poses->
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  __n = lVar10 >> 3;
  local_100 = (Vector<double,3> *)track_pos;
  tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (__n < 2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"At least two poses required");
LAB_00118e25:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (lVar10 != (long)(positions->
                      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(positions->
                      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Poses and positions size mismatch");
    goto LAB_00118e25;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,__n,
             (allocator_type *)auStack_88);
  auStack_88 = (undefined1  [8])((ulong)(uint)auStack_88._4_4_ << 0x20);
  local_110 = outliers;
  local_108 = stats;
  math::Vector<float,_3>::fill
            ((Vector<float,_3> *)
             ((long)&position_pair.
                     super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),(float *)auStack_88);
  ppCVar11 = (poses->
             super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar12 = (poses->
             super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  __return_storage_ptr__ = tmp_pos.v + 2;
  uVar14 = 0;
  while (uVar14 < (ulong)((long)ppCVar12 - (long)ppCVar11 >> 3)) {
    local_128 = uVar14 * 8;
    uVar15 = uVar14 + 1;
    local_120 = uVar14;
    local_118 = uVar15;
    for (; uVar14 = local_118, uVar15 < (ulong)((long)ppCVar12 - (long)ppCVar11 >> 3);
        uVar15 = uVar15 + 1) {
      auStack_88 = (undefined1  [8])0x0;
      pose_pair.
      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pose_pair.
      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_f8 = (undefined1  [8])0x0;
      position_pair.
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      position_pair.
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::push_back
                ((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *)
                 auStack_88,ppCVar11 + local_120);
      std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::push_back
                ((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *)
                 auStack_88,
                 (poses->
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar15);
      std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::push_back
                ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                 auStack_f8,
                 (value_type *)
                 ((long)((positions->
                         super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->v + local_128));
      std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::push_back
                ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                 auStack_f8,
                 (positions->
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar15);
      triangulate_track((Vector<double,_3> *)local_168,
                        (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                        auStack_f8,
                        (vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *
                        )auStack_88);
      if (((!NAN((double)local_168 - (double)local_168) && !NAN((double)local_168)) &&
          (!NAN(tmp_pos.v[0] - tmp_pos.v[0]) && !NAN(tmp_pos.v[0]))) &&
         (!NAN(tmp_pos.v[1] - tmp_pos.v[1]) && !NAN(tmp_pos.v[1]))) {
        if (0.0 < (double)tmp_outliers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[1]) {
          CameraPose::fill_camera_pos(*(CameraPose **)auStack_88,(Vector<double,_3> *)auStack_68);
          math::Vector<double,_3>::operator-
                    ((Vector<double,_3> *)__return_storage_ptr__,(Vector<double,_3> *)local_168,
                     (Vector<double,_3> *)auStack_68);
          math::Vector<double,_3>::normalized
                    ((Vector<double,_3> *)auStack_a8,(Vector<double,_3> *)__return_storage_ptr__);
          CameraPose::fill_camera_pos
                    (*(pointer)((long)auStack_88 + 8),(Vector<double,_3> *)auStack_68);
          math::Vector<double,_3>::operator-
                    ((Vector<double,_3> *)(best_pos.v + 1),(Vector<double,_3> *)local_168,
                     (Vector<double,_3> *)auStack_68);
          math::Vector<double,_3>::normalized
                    ((Vector<double,_3> *)__return_storage_ptr__,
                     (Vector<double,_3> *)(best_pos.v + 1));
          dVar3 = math::Vector<double,_3>::dot
                            ((Vector<double,_3> *)auStack_a8,
                             (Vector<double,_3> *)__return_storage_ptr__);
          if ((double)tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[3] <= dVar3 &&
              dVar3 != (double)tmp_outliers.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[3])
          goto LAB_00118ce9;
        }
        auStack_68 = (undefined1  [8])0x0;
        tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        best_pos.v._4_8_ = 0;
        while( true ) {
          ppCVar11 = (poses->
                     super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(poses->
                            super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar11 >> 3) <=
              (ulong)best_pos.v._4_8_) break;
          math::Matrix<double,_3,_3>::mult
                    ((Vector<double,_3> *)__return_storage_ptr__,&ppCVar11[best_pos.v._4_8_]->R,
                     (Vector<double,_3> *)local_168);
          math::Vector<double,_3>::operator+
                    ((Vector<double,_3> *)auStack_a8,(Vector<double,_3> *)__return_storage_ptr__,
                     &(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[best_pos.v._4_8_]->t);
          if (ray0.v[1] <= 0.0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68,
                       (value_type_conflict4 *)(best_pos.v + 1));
          }
          else {
            math::Matrix<double,_3,_3>::mult
                      ((Vector<double,_3> *)__return_storage_ptr__,
                       &(poses->
                        super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[best_pos.v._4_8_]->K,
                       (Vector<double,_3> *)auStack_a8);
            uVar8 = best_pos.v._4_8_;
            ray0.v[1] = ray1.v[1];
            auStack_a8 = (undefined1  [8])tmp_pos.v[2];
            ray0.v[0] = ray1.v[0];
            tmp_pos.v[2] = tmp_pos.v[2] / ray1.v[1];
            ray1.v[0] = ray1.v[0] / ray1.v[1];
            pVVar1 = (positions->
                     super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            math::Vector<float,_2>::Vector<double>
                      (&local_130,(Vector<double,_2> *)__return_storage_ptr__);
            math::Vector<float,_2>::operator-((Vector<float,_2> *)(ray1.v + 2),pVVar1 + uVar8);
            fVar16 = math::Vector<float,_2>::norm((Vector<float,_2> *)(ray1.v + 2));
            if ((double)*tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage <= (double)fVar16 &&
                (double)fVar16 !=
                (double)*tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68,
                         (value_type_conflict4 *)(best_pos.v + 1));
            }
          }
          best_pos.v._4_8_ = best_pos.v._4_8_ + 1;
        }
        if ((ulong)((long)tmp_outliers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)auStack_68) <
            (ulong)((long)best_outliers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)auStack_48)) {
          math::Vector<float,3>::operator=
                    ((Vector<float,3> *)
                     ((long)&position_pair.
                             super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     (Vector<double,_3> *)local_168);
          auVar9 = auStack_48;
          auStack_48 = auStack_68;
          puVar2 = tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar4 = tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          auStack_68 = auVar9;
          tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
          tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = puVar2;
          best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar4;
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68);
      }
LAB_00118ce9:
      std::_Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
      ~_Vector_base((_Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                     *)auStack_f8);
      std::_Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
      ~_Vector_base((_Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                     *)auStack_88);
      ppCVar11 = (poses->
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppCVar12 = (poses->
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  fVar16 = math::Vector<float,_3>::norm
                     ((Vector<float,_3> *)
                      ((long)&position_pair.
                              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pSVar7 = local_108;
  pvVar6 = local_110;
  if ((fVar16 != 0.0) || (NAN(fVar16))) {
    if ((ulong)((long)(int)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[2] +
               ((long)best_outliers.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_48 >> 3)) <=
        (ulong)((long)(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3)) {
      math::Vector<double,3>::operator=
                (local_100,
                 (Vector<float,_3> *)
                 ((long)&position_pair.
                         super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (pSVar7 != (Statistics *)0x0) {
        *(int *)pSVar7 = *(int *)pSVar7 + 1;
      }
      bVar13 = true;
      if (pvVar6 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        puVar4 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        puVar5 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        puVar2 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)auStack_48;
        (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
        auStack_48 = (undefined1  [8])puVar4;
        best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar5;
        best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      goto LAB_00118d88;
    }
    if (local_108 != (Statistics *)0x0) {
      *(int *)(local_108 + 4) = *(int *)(local_108 + 4) + 1;
    }
  }
  else if (local_108 != (Statistics *)0x0) {
    *(int *)(local_108 + 0xc) = *(int *)(local_108 + 0xc) + 1;
  }
  bVar13 = false;
LAB_00118d88:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48);
  return bVar13;
}

Assistant:

bool
Triangulate::triangulate (std::vector<CameraPose const*> const& poses,
    std::vector<math::Vec2f> const& positions,
    math::Vec3d* track_pos, Statistics* stats,
    std::vector<std::size_t>* outliers) const
{
    if (poses.size() < 2)
        throw std::invalid_argument("At least two poses required");
    if (poses.size() != positions.size())
        throw std::invalid_argument("Poses and positions size mismatch");

    /* Check all possible pose pairs for successful triangulation */
    std::vector<std::size_t> best_outliers(positions.size());
    math::Vec3f best_pos(0.0f);
    for (std::size_t p1 = 0; p1 < poses.size(); ++p1)
        for (std::size_t p2 = p1 + 1; p2 < poses.size(); ++p2)
        {
            /* Triangulate position from current pair */
            std::vector<CameraPose const*> pose_pair;
            std::vector<math::Vec2f> position_pair;
            pose_pair.push_back(poses[p1]);
            pose_pair.push_back(poses[p2]);
            position_pair.push_back(positions[p1]);
            position_pair.push_back(positions[p2]);
            math::Vec3d tmp_pos = triangulate_track(position_pair, pose_pair);
            if (MATH_ISNAN(tmp_pos[0]) || MATH_ISINF(tmp_pos[0]) ||
                MATH_ISNAN(tmp_pos[1]) || MATH_ISINF(tmp_pos[1]) ||
                MATH_ISNAN(tmp_pos[2]) || MATH_ISINF(tmp_pos[2]))
                continue;

            /* Check if pair has small triangulation angle. */
            if (this->opts.angle_threshold > 0.0)
            {
                math::Vec3d camera_pos;
                pose_pair[0]->fill_camera_pos(&camera_pos);
                math::Vec3d ray0 = (tmp_pos - camera_pos).normalized();
                pose_pair[1]->fill_camera_pos(&camera_pos);
                math::Vec3d ray1 = (tmp_pos - camera_pos).normalized();
                double const cos_angle = ray0.dot(ray1);
                if (cos_angle > this->cos_angle_thres)
                    continue;
            }

            /* Chek error in all input poses and find outliers. */
            std::vector<std::size_t> tmp_outliers;
            for (std::size_t i = 0; i < poses.size(); ++i)
            {
                math::Vec3d x = poses[i]->R * tmp_pos + poses[i]->t;

                /* Reject track if it appears behind the camera. */
                if (x[2] <= 0.0)
                {
                    tmp_outliers.push_back(i);
                    continue;
                }

                x = poses[i]->K * x;
                math::Vec2d x2d(x[0] / x[2], x[1] / x[2]);
                double error = (positions[i] - x2d).norm();
                if (error > this->opts.error_threshold)
                    tmp_outliers.push_back(i);
            }

            /* Select triangulation with lowest amount of outliers. */
            if (tmp_outliers.size() < best_outliers.size())
            {
                best_pos = tmp_pos;
                std::swap(best_outliers, tmp_outliers);
            }

        }

    /* If all pairs have small angles pos will be 0 here. */
    if (best_pos.norm() == 0.0f)
    {
        if (stats != nullptr)
            stats->num_too_small_angle += 1;
        return false;
    }

    /* Check if required number of inliers is found. */
    if (poses.size() < best_outliers.size() + this->opts.min_num_views)
    {
        if (stats != nullptr)
            stats->num_large_error += 1;
        return false;
    }

    /* Return final position and outliers. */
    *track_pos = best_pos;
    if (stats != nullptr)
        stats->num_new_tracks += 1;
    if (outliers != nullptr)
        std::swap(*outliers, best_outliers);

    return true;
}